

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_tracek(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  IROp1 IVar3;
  uint uVar4;
  int iVar5;
  GCtrace *pGVar6;
  IRIns *ir;
  
  pGVar6 = jit_checktrace(L);
  uVar4 = lj_lib_checkint(L,2);
  iVar5 = 0;
  if (((pGVar6 != (GCtrace *)0x0) && (0xffff7fff < uVar4)) &&
     (iVar5 = 0, pGVar6->nk <= uVar4 + 0x8000)) {
    ir = pGVar6->ir + (uVar4 + 0x8000);
    IVar3 = (ir->field_1).o;
    if (IVar3 == '\x1e') {
      uVar4 = (uint)(ir->field_0).op2;
      ir = pGVar6->ir + (ir->field_0).op1;
      IVar3 = (ir->field_1).o;
    }
    else {
      uVar4 = 0xffffffff;
    }
    if ((IVar3 == '\x1d') && (*(long *)((L->glref).ptr64 + 0x180) == 0)) {
      pTVar1 = L->top;
      uVar2 = (L->stack).ptr64;
      luaopen_ffi(L);
      L->top = (TValue *)((long)pTVar1 + ((L->stack).ptr64 - uVar2));
    }
    lj_ir_kvalue(L,L->top + -2,ir);
    L->top[-1].n = (double)((ir->field_1).t.irt & 0x1f);
    iVar5 = 2;
    if (uVar4 != 0xffffffff) {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pTVar1->n = (double)(int)uVar4;
      iVar5 = 3;
    }
  }
  return iVar5;
}

Assistant:

LJLIB_CF(jit_util_tracek)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= T->nk && ref < REF_BIAS) {
    IRIns *ir = &T->ir[ref];
    int32_t slot = -1;
    if (ir->o == IR_KSLOT) {
      slot = ir->op2;
      ir = &T->ir[ir->op1];
    }
#if LJ_HASFFI
    if (ir->o == IR_KINT64) ctype_loadffi(L);
#endif
    lj_ir_kvalue(L, L->top-2, ir);
    setintV(L->top-1, (int32_t)irt_type(ir->t));
    if (slot == -1)
      return 2;
    setintV(L->top++, slot);
    return 3;
  }
  return 0;
}